

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osTime.cpp
# Opt level: O2

char * osTime::GetTimestamp(void)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint64_t uVar3;
  
  uVar3 = GetTime();
  uVar1 = uVar3 / 1000000 & 0xffffffff;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3 / 1000;
  snprintf(GetTimestamp::s,0x40,"%u:%02u:%02u.%03u",((uVar3 / 1000000 & 0xffffffff) / 0xe10) % 0x18,
           (uVar1 / 0x3c) % 0x3c,uVar1 % 0x3c,SUB164(auVar2 % ZEXT816(1000),0));
  return GetTimestamp::s;
}

Assistant:

const char* osTime::GetTimestamp()
{
    static char s[64];
    uint32_t seconds;
    uint32_t sec;
    uint32_t min;
    uint32_t hour;
    uint64_t time;

    time = GetTime();

    seconds = (uint32_t)(time / 1000000);

    sec = seconds % 60;

    min = seconds / 60;
    min %= 60;

    hour = seconds / (60 * 60);
    hour %= 24;

#ifdef OSTIME_SHOW_PROCESSOR_TIMESTAMP
    struct _timeb timebuffer;
    _ftime(&timebuffer);
    char* timeline;
    timeline = ctime(&(timebuffer.time));
    timeline = strchr(timeline, ':') - 2;
    snprintf(s,
             sizeof(s),
             "%.8s.%hu(%u:%02u:%02u.%03u)",
             timeline,
             timebuffer.millitm,
             hour,
             min,
             sec,
             (uint32_t)((time / 1000) % 1000));
#else
    snprintf(s, sizeof(s), "%u:%02u:%02u.%03u", hour, min, sec, (uint32_t)((time / 1000) % 1000));
#endif
    return s;
}